

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils_capi.c
# Opt level: O0

void capi_read_key_Engine(EVP_PKEY **key,char *id,ENGINE *e,char *storename)

{
  int iVar1;
  ulong e_00;
  char *pcVar2;
  EVP_PKEY *pEVar3;
  char *storename_local;
  ENGINE *e_local;
  char *id_local;
  EVP_PKEY **key_local;
  
  iVar1 = ENGINE_ctrl((ENGINE *)e,0xd4,0,storename,(f *)0x0);
  if (iVar1 == 0) {
    ERR_load_CRYPTO_strings();
    e_00 = ERR_peek_last_error();
    pcVar2 = ERR_error_string(e_00,(char *)0x0);
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils_capi.c"
            ,0xc,"Executing CAPI_CMD_STORE_NAME did not succeed: %s",pcVar2);
    exit(1);
  }
  pEVar3 = ENGINE_load_private_key((ENGINE *)e,id,(UI_METHOD *)0x0,(void *)0x0);
  *key = (EVP_PKEY *)pEVar3;
  if (key != (EVP_PKEY **)0x0) {
    return;
  }
  log_log(2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils_capi.c"
          ,0x13,"Could not load key %s from storename %s",id,storename);
  exit(0x5d);
}

Assistant:

void capi_read_key_Engine(EVP_PKEY** key, char* id, ENGINE *e, char* storename) {
	if(!ENGINE_ctrl(e, CAPI_CMD_STORE_NAME, 0, (void*)storename, NULL)) {
		ERR_load_CRYPTO_strings();
        log_error("Executing CAPI_CMD_STORE_NAME did not succeed: %s", ERR_error_string(ERR_peek_last_error(), NULL));
		ERR_free_strings();
		exit(SCEP_PKISTATUS_ERROR);
	}
	//loading the key
	*key = ENGINE_load_private_key(e, id, NULL, NULL);
	if(!key) {
        log_info("Could not load key %s from storename %s", id, storename);
		exit(SCEP_PKISTATUS_FILE);
	}

	//ENGINE_ctrl(e, CAPI_CMD_STORE_NAME, 0, (void*)"MY", NULL);
}